

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_serializer.hpp
# Opt level: O3

void __thiscall
duckdb::BinarySerializer::BinarySerializer
          (BinarySerializer *this,WriteStream *stream,SerializationOptions *options_p)

{
  bool bVar1;
  
  (this->super_Serializer)._vptr_Serializer = (_func_int **)&PTR__Serializer_02436610;
  (this->super_Serializer).options.serialize_enum_as_string = false;
  (this->super_Serializer).options.serialize_default_values = false;
  SerializationCompatibility::Default();
  SerializationData::SerializationData(&(this->super_Serializer).data);
  (this->super_Serializer)._vptr_Serializer = (_func_int **)&PTR__BinarySerializer_02436bd8;
  (this->debug_stack).
  super_vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  .
  super__Vector_base<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->debug_stack).
  super_vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  .
  super__Vector_base<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->debug_stack).
  super_vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  .
  super__Vector_base<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->stream = stream;
  SerializationData::SerializationData(&this->data);
  bVar1 = options_p->serialize_default_values;
  (this->super_Serializer).options.serialize_enum_as_string = options_p->serialize_enum_as_string;
  (this->super_Serializer).options.serialize_default_values = bVar1;
  ::std::__cxx11::string::operator=
            ((string *)&(this->super_Serializer).options.serialization_compatibility,
             (string *)&options_p->serialization_compatibility);
  (this->super_Serializer).options.serialization_compatibility.serialization_version =
       (options_p->serialization_compatibility).serialization_version;
  (this->super_Serializer).options.serialization_compatibility.manually_set =
       (options_p->serialization_compatibility).manually_set;
  (this->super_Serializer).options.serialize_enum_as_string = false;
  return;
}

Assistant:

explicit BinarySerializer(WriteStream &stream, SerializationOptions options_p = SerializationOptions())
	    : stream(stream) {
		options = std::move(options_p);
		// Override the value set by the passed in SerializationOptions
		options.serialize_enum_as_string = false;
	}